

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O2

void __thiscall
Pl_DCT::Members::Members
          (Members *this,JDIMENSION image_width,JDIMENSION image_height,int components,
          J_COLOR_SPACE color_space,CompressConfig *config_callback)

{
  this->action = a_compress;
  Pl_Buffer::Pl_Buffer(&this->buf,"DCT uncompressed image",(Pipeline *)0x0);
  this->image_width = image_width;
  this->image_height = image_height;
  this->components = components;
  this->color_space = color_space;
  this->config_callback = config_callback;
  return;
}

Assistant:

Members(
        JDIMENSION image_width,
        JDIMENSION image_height,
        int components,
        J_COLOR_SPACE color_space,
        CompressConfig* config_callback) :
        action(a_compress),
        buf("DCT uncompressed image"),
        image_width(image_width),
        image_height(image_height),
        components(components),
        color_space(color_space),
        config_callback(config_callback)
    {
    }